

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

void * dlrealloc_in_place(void *oldmem,size_t bytes)

{
  int iVar1;
  int *piVar2;
  mstate pmVar3;
  void *pvVar4;
  int can_move;
  undefined8 in_RCX;
  size_t in_RDX;
  size_t extraout_RDX;
  uint uVar5;
  mchunkptr p;
  
  iVar1 = _gm_.mutex;
  can_move = (int)in_RCX;
  if (oldmem == (void *)0x0) {
    return (void *)0x0;
  }
  if (bytes < 0xffffffffffffff80) {
    p = (mchunkptr)&DAT_00000020;
    if (0x16 < bytes) {
      p = (mchunkptr)(bytes + 0x17 & 0xfffffffffffffff0);
    }
    if (((byte)_gm_.mflags & 2) != 0) {
      uVar5 = 1;
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
      if (iVar1 != 0) {
        while (can_move = (int)in_RCX, _gm_.mutex != 0) {
          if ((uVar5 & 0x3f) == 0) {
            sched_yield();
            in_RDX = extraout_RDX;
          }
          uVar5 = uVar5 + 1;
        }
        LOCK();
        _gm_.mutex = 1;
        UNLOCK();
      }
    }
    pmVar3 = (mstate)try_realloc_chunk((mstate)((long)oldmem + -0x10),p,in_RDX,can_move);
    if (((byte)_gm_.mflags & 2) != 0) {
      _gm_.mutex = 0;
    }
    pvVar4 = (void *)0x0;
    if (pmVar3 == (mstate)((long)oldmem + -0x10)) {
      pvVar4 = oldmem;
    }
  }
  else {
    piVar2 = _PDCLIB_errno_func();
    *piVar2 = 0xc;
    pvVar4 = (void *)0x0;
  }
  return pvVar4;
}

Assistant:

void* dlrealloc_in_place(void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem != 0) {
    if (bytes >= MAX_REQUEST) {
      MALLOC_FAILURE_ACTION;
    }
    else {
      size_t nb = request2size(bytes);
      mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
      mstate m = gm;
#else /* FOOTERS */
      mstate m = get_mstate_for(oldp);
      if (!ok_magic(m)) {
        USAGE_ERROR_ACTION(m, oldmem);
        return 0;
      }
#endif /* FOOTERS */
      if (!PREACTION(m)) {
        mchunkptr newp = try_realloc_chunk(m, oldp, nb, 0);
        POSTACTION(m);
        if (newp == oldp) {
          check_inuse_chunk(m, newp);
          mem = oldmem;
        }
      }
    }
  }
  return mem;
}